

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_close(ssl_connect_data *connssl)

{
  ssl_connect_data *connssl_local;
  
  if (connssl->backend->handle != (SSL *)0x0) {
    SSL_shutdown((SSL *)connssl->backend->handle);
    SSL_set_connect_state((SSL *)connssl->backend->handle);
    SSL_free((SSL *)connssl->backend->handle);
    connssl->backend->handle = (SSL *)0x0;
  }
  if (connssl->backend->ctx != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)connssl->backend->ctx);
    connssl->backend->ctx = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

static void ossl_close(struct ssl_connect_data *connssl)
{
  if(BACKEND->handle) {
    (void)SSL_shutdown(BACKEND->handle);
    SSL_set_connect_state(BACKEND->handle);

    SSL_free(BACKEND->handle);
    BACKEND->handle = NULL;
  }
  if(BACKEND->ctx) {
    SSL_CTX_free(BACKEND->ctx);
    BACKEND->ctx = NULL;
  }
}